

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

void botpCtrNext(octet *ctr)

{
  bool bVar1;
  octet oVar2;
  byte bVar3;
  octet carry;
  octet *ctr_local;
  
  oVar2 = ctr[7] + '\x01';
  ctr[7] = oVar2;
  bVar3 = ctr[6] + (oVar2 == '\0');
  ctr[6] = bVar3;
  bVar1 = bVar3 < (oVar2 == '\0');
  bVar3 = ctr[5] + bVar1;
  ctr[5] = bVar3;
  bVar1 = bVar3 < bVar1;
  bVar3 = ctr[4] + bVar1;
  ctr[4] = bVar3;
  bVar1 = bVar3 < bVar1;
  bVar3 = ctr[3] + bVar1;
  ctr[3] = bVar3;
  bVar1 = bVar3 < bVar1;
  bVar3 = ctr[2] + bVar1;
  ctr[2] = bVar3;
  bVar1 = bVar3 < bVar1;
  bVar3 = ctr[1] + bVar1;
  ctr[1] = bVar3;
  *ctr = *ctr + (bVar3 < bVar1);
  return;
}

Assistant:

void botpCtrNext(octet ctr[8])
{
	register octet carry = 1;
	ASSERT(memIsValid(ctr, 8));
	carry = ((ctr[7] += carry) < carry);
	carry = ((ctr[6] += carry) < carry);
	carry = ((ctr[5] += carry) < carry);
	carry = ((ctr[4] += carry) < carry);
	carry = ((ctr[3] += carry) < carry);
	carry = ((ctr[2] += carry) < carry);
	carry = ((ctr[1] += carry) < carry);
	carry = ((ctr[0] += carry) < carry);
	carry = 0;
}